

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)33>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  Result RVar2;
  Expr *pEVar3;
  Enum EVar4;
  Var local_b8;
  Var local_70;
  
  Var::Var(&local_b8);
  RVar2 = ParseMemidx(this,loc,&local_b8);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    pEVar3 = (Expr *)operator_new(0x88);
    Var::Var(&local_70,&local_b8);
    (pEVar3->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar3->_vptr_Expr = (_func_int **)&PTR__Expr_0018dd68;
    (pEVar3->loc).filename._M_len = loc.filename._M_len;
    (pEVar3->loc).filename._M_str = loc.filename._M_str;
    (pEVar3->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar3->loc).field_1 + 8) = loc.field_1._8_8_;
    pEVar3->type_ = MemorySize;
    pEVar3->_vptr_Expr = (_func_int **)&PTR__MemoryExpr_0018eee0;
    Var::Var((Var *)(pEVar3 + 1),&local_70);
    pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar3;
    if (pEVar1 != (Expr *)0x0) {
      (*pEVar1->_vptr_Expr[1])();
    }
    Var::~Var(&local_70);
    EVar4 = Ok;
  }
  Var::~Var(&local_b8);
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseMemoryExpr(Location loc,
                                   std::unique_ptr<Expr>* out_expr) {
  Var memidx;
  CHECK_RESULT(ParseMemidx(loc, &memidx));
  out_expr->reset(new T(memidx, loc));
  return Result::Ok;
}